

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_models_md3.cpp
# Opt level: O0

void __thiscall FMD3Model::BuildVertexBuffer(FMD3Model *this)

{
  FModelVertexBuffer *this_00;
  FModelVertex *pFVar1;
  uint *puVar2;
  MD3Surface *this_01;
  MD3Vertex *pMVar3;
  int iVar4;
  int local_84;
  int local_80;
  int l;
  int k;
  int tc;
  FModelVertex *bvert;
  MD3Vertex *vert;
  int j;
  MD3Surface *surf_1;
  uint local_50;
  int i_1;
  uint iindex;
  uint vindex;
  uint *indxptr;
  FModelVertex *vertptr;
  MD3Surface *surf;
  uint local_18;
  int i;
  uint ibufsize;
  uint vbufsize;
  FMD3Model *this_local;
  
  if ((this->super_FModel).mVBuf == (FModelVertexBuffer *)0x0) {
    LoadGeometry(this);
    i = 0;
    local_18 = 0;
    for (surf._4_4_ = 0; surf._4_4_ < this->numSurfaces; surf._4_4_ = surf._4_4_ + 1) {
      i = this->numFrames * this->surfaces[surf._4_4_].numVertices + i;
      local_18 = this->surfaces[surf._4_4_].numTriangles * 3 + local_18;
    }
    this_00 = (FModelVertexBuffer *)operator_new(0x28);
    FModelVertexBuffer::FModelVertexBuffer(this_00,true,this->numFrames == 1);
    (this->super_FModel).mVBuf = this_00;
    pFVar1 = FModelVertexBuffer::LockVertexBuffer((this->super_FModel).mVBuf,i);
    puVar2 = FModelVertexBuffer::LockIndexBuffer((this->super_FModel).mVBuf,local_18);
    if (pFVar1 == (FModelVertex *)0x0 || puVar2 == (uint *)0x0) {
      __assert_fail("vertptr != nullptr && indxptr != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/gl/models/gl_models_md3.cpp"
                    ,0x114,"virtual void FMD3Model::BuildVertexBuffer()");
    }
    i_1 = 0;
    local_50 = 0;
    for (surf_1._4_4_ = 0; surf_1._4_4_ < this->numSurfaces; surf_1._4_4_ = surf_1._4_4_ + 1) {
      this_01 = this->surfaces + surf_1._4_4_;
      this_01->vindex = i_1;
      this_01->iindex = local_50;
      for (vert._4_4_ = 0; vert._4_4_ < this->numFrames * this_01->numVertices;
          vert._4_4_ = vert._4_4_ + 1) {
        pMVar3 = this_01->vertices + vert._4_4_;
        iVar4 = vert._4_4_ % this_01->numVertices;
        FModelVertex::Set(pFVar1 + (uint)i_1,pMVar3->x,pMVar3->z,pMVar3->y,
                          this_01->texcoords[iVar4].s,this_01->texcoords[iVar4].t);
        FModelVertex::SetNormal(pFVar1 + (uint)i_1,pMVar3->nx,pMVar3->nz,pMVar3->ny);
        i_1 = i_1 + 1;
      }
      for (local_80 = 0; local_80 < this_01->numTriangles; local_80 = local_80 + 1) {
        for (local_84 = 0; local_84 < 3; local_84 = local_84 + 1) {
          puVar2[local_50] = this_01->tris[local_80].VertIndex[local_84];
          local_50 = local_50 + 1;
        }
      }
      MD3Surface::UnloadGeometry(this_01);
    }
    FModelVertexBuffer::UnlockVertexBuffer((this->super_FModel).mVBuf);
    FModelVertexBuffer::UnlockIndexBuffer((this->super_FModel).mVBuf);
  }
  return;
}

Assistant:

void FMD3Model::BuildVertexBuffer()
{
	if (mVBuf == nullptr)
	{
		LoadGeometry();

		unsigned int vbufsize = 0;
		unsigned int ibufsize = 0;

		for (int i = 0; i < numSurfaces; i++)
		{
			MD3Surface * surf = &surfaces[i];
			vbufsize += numFrames * surf->numVertices;
			ibufsize += 3 * surf->numTriangles;
		}

		mVBuf = new FModelVertexBuffer(true, numFrames == 1);
		FModelVertex *vertptr = mVBuf->LockVertexBuffer(vbufsize);
		unsigned int *indxptr = mVBuf->LockIndexBuffer(ibufsize);

		assert(vertptr != nullptr && indxptr != nullptr);

		unsigned int vindex = 0, iindex = 0;

		for (int i = 0; i < numSurfaces; i++)
		{
			MD3Surface * surf = &surfaces[i];

			surf->vindex = vindex;
			surf->iindex = iindex;
			for (int j = 0; j < numFrames * surf->numVertices; j++)
			{
				MD3Vertex* vert = surf->vertices + j;

				FModelVertex *bvert = &vertptr[vindex++];

				int tc = j % surf->numVertices;
				bvert->Set(vert->x, vert->z, vert->y, surf->texcoords[tc].s, surf->texcoords[tc].t);
				bvert->SetNormal(vert->nx, vert->nz, vert->ny);
			}

			for (int k = 0; k < surf->numTriangles; k++)
			{
				for (int l = 0; l < 3; l++)
				{
					indxptr[iindex++] = surf->tris[k].VertIndex[l];
				}
			}
			surf->UnloadGeometry();
		}
		mVBuf->UnlockVertexBuffer();
		mVBuf->UnlockIndexBuffer();
	}
}